

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_face.c
# Opt level: O2

REF_STATUS ref_face_normal(REF_DBL *xyz0,REF_DBL *xyz1,REF_DBL *xyz2,REF_DBL *xyz3,REF_DBL *normal)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  *normal = 0.0;
  normal[1] = 0.0;
  normal[2] = 0.0;
  dVar5 = *xyz2 - *xyz1;
  dVar3 = xyz2[1] - xyz1[1];
  dVar4 = xyz2[2] - xyz1[2];
  dVar2 = xyz0[1] - xyz1[1];
  dVar6 = xyz0[2] - xyz1[2];
  dVar7 = *xyz0 - *xyz1;
  dVar1 = (dVar3 * dVar6 - dVar2 * dVar4) * 0.5 + 0.0;
  dVar4 = (dVar4 * dVar7 - dVar6 * dVar5) * 0.5 + 0.0;
  *normal = dVar1;
  normal[1] = dVar4;
  dVar2 = (dVar5 * dVar2 - dVar7 * dVar3) * 0.5 + 0.0;
  normal[2] = dVar2;
  dVar3 = *xyz0 - *xyz3;
  dVar5 = xyz0[1] - xyz3[1];
  dVar6 = xyz0[2] - xyz3[2];
  dVar7 = xyz2[1] - xyz3[1];
  dVar8 = xyz2[2] - xyz3[2];
  dVar9 = *xyz2 - *xyz3;
  *normal = (dVar5 * dVar8 - dVar7 * dVar6) * 0.5 + dVar1;
  normal[1] = (dVar6 * dVar9 - dVar8 * dVar3) * 0.5 + dVar4;
  normal[2] = (dVar3 * dVar7 - dVar9 * dVar5) * 0.5 + dVar2;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_face_normal(REF_DBL *xyz0, REF_DBL *xyz1, REF_DBL *xyz2,
                                   REF_DBL *xyz3, REF_DBL *normal) {
  REF_DBL edge1[3], edge2[3];

  normal[0] = 0.0;
  normal[1] = 0.0;
  normal[2] = 0.0;

  edge1[0] = xyz2[0] - xyz1[0];
  edge1[1] = xyz2[1] - xyz1[1];
  edge1[2] = xyz2[2] - xyz1[2];

  edge2[0] = xyz0[0] - xyz1[0];
  edge2[1] = xyz0[1] - xyz1[1];
  edge2[2] = xyz0[2] - xyz1[2];

  normal[0] += 0.5 * (edge1[1] * edge2[2] - edge1[2] * edge2[1]);
  normal[1] += 0.5 * (edge1[2] * edge2[0] - edge1[0] * edge2[2]);
  normal[2] += 0.5 * (edge1[0] * edge2[1] - edge1[1] * edge2[0]);

  edge1[0] = xyz0[0] - xyz3[0];
  edge1[1] = xyz0[1] - xyz3[1];
  edge1[2] = xyz0[2] - xyz3[2];

  edge2[0] = xyz2[0] - xyz3[0];
  edge2[1] = xyz2[1] - xyz3[1];
  edge2[2] = xyz2[2] - xyz3[2];

  normal[0] += 0.5 * (edge1[1] * edge2[2] - edge1[2] * edge2[1]);
  normal[1] += 0.5 * (edge1[2] * edge2[0] - edge1[0] * edge2[2]);
  normal[2] += 0.5 * (edge1[0] * edge2[1] - edge1[1] * edge2[0]);

  return REF_SUCCESS;
}